

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_object.cpp
# Opt level: O2

value * __thiscall
mjs::anon_unknown_35::parse_float
          (value *__return_storage_ptr__,anon_unknown_35 *this,
          gc_heap_ptr<mjs::global_object> *global,wstring_view s)

{
  void *pvVar1;
  wistream *pwVar2;
  size_t sVar3;
  wstring_view s_00;
  allocator<wchar_t> local_1c9;
  double val;
  wstring_view local_1a8;
  wistringstream wiss;
  
  sVar3 = s._M_len;
  pvVar1 = gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)this);
  s_00._M_str._0_4_ = *(undefined4 *)((long)pvVar1 + 0x20);
  s_00._M_len = s._M_len;
  s_00._M_str._4_4_ = 0;
  local_1a8 = ltrim((mjs *)global,s_00,(version)sVar3);
  std::__cxx11::wstring::wstring<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>,void>
            ((wstring *)&val,&local_1a8,&local_1c9);
  std::__cxx11::wistringstream::basic_istringstream((wstring *)&wiss,(_Ios_Openmode)&val);
  std::__cxx11::wstring::~wstring((wstring *)&val);
  pwVar2 = std::wistream::_M_extract<double>((double *)&wiss);
  if (((byte)pwVar2[*(long *)(*(long *)pwVar2 + -0x18) + 0x20] & 5) != 0) {
    val = NAN;
  }
  __return_storage_ptr__->type_ = number;
  (__return_storage_ptr__->field_1).n_ = val;
  std::__cxx11::wistringstream::~wistringstream((wistringstream *)&wiss);
  return __return_storage_ptr__;
}

Assistant:

value parse_float(const gc_heap_ptr<global_object>& global, const std::wstring_view s) {
    std::wistringstream wiss{std::wstring{ltrim(s, global->language_version())}};
    double val;
    return value{wiss >> val ? val : NAN};
}